

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O1

H265eDpbFrm * h265e_find_cpb_frame(H265eDpbFrm *frms,RK_S32 cnt,EncFrmStatus *frm)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  H265eDpbFrm *unaff_RBP;
  undefined4 in_register_00000034;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar3 = (ulong *)CONCAT44(in_register_00000034,cnt);
  if ((*puVar3 & 1) != 0) {
    uVar2 = *puVar3 >> 0x30;
    if (((byte)h265e_debug & 0x80) != 0) {
      _mpp_log_l(4,"h265e_dpb","frm %d start finding slot \n",(char *)0x0,uVar2);
    }
    uVar5 = 0;
    do {
      if (*(char *)&frms->field_7 != '\0') {
        bVar1 = true;
        if ((((frms->status).val & 1) != 0) && (uVar4 = (frms->status).val >> 0x30, uVar4 == uVar2))
        {
          if (((byte)h265e_debug & 0x80) != 0) {
            in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),1);
            _mpp_log_l(4,"h265e_dpb","frm %d match slot %d valid %d\n",(char *)0x0,uVar4,
                       uVar5 & 0xffffffff,in_RAX);
          }
          unaff_RBP = frms;
          if ((*puVar3 & 4) == 0) {
            if ((((uint)*puVar3 ^ *(uint *)&frms->status) & 0x40) != 0) {
              in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x21e);
              _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "p->is_non_ref == frm->is_non_ref","h265e_find_cpb_frame",in_RAX);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001ccf97;
            }
            if ((char)((byte)*puVar3 ^ *(byte *)&frms->status) < '\0') {
              in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x21f);
              _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "p->is_lt_ref == frm->is_lt_ref","h265e_find_cpb_frame",in_RAX);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001ccf97;
            }
            if ((((uint)*puVar3 ^ *(uint *)&frms->status) & 0xf00) != 0) {
              in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x220);
              _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "p->lt_idx == frm->lt_idx","h265e_find_cpb_frame",in_RAX);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001ccf97;
            }
            if ((((uint)*puVar3 ^ *(uint *)&frms->status) & 0xf000) != 0) {
              in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x221);
              bVar1 = false;
              _mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "p->temporal_id == frm->temporal_id","h265e_find_cpb_frame",in_RAX);
              if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001ccf97:
                abort();
              }
              goto LAB_001ccf49;
            }
          }
          bVar1 = false;
        }
LAB_001ccf49:
        if (!bVar1) {
          return unaff_RBP;
        }
      }
      uVar5 = uVar5 + 1;
      frms = frms + 1;
    } while (uVar5 != 0x10);
    _mpp_log_l(2,"h265e_dpb","can not find match frm %d\n","h265e_find_cpb_frame",uVar2);
  }
  return (H265eDpbFrm *)0x0;
}

Assistant:

static H265eDpbFrm *h265e_find_cpb_frame(H265eDpbFrm *frms, RK_S32 cnt, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 i;

    if (!frm->valid)
        return NULL;

    h265e_dbg_dpb("frm %d start finding slot \n", frm->seq_idx);
    for (i = 0; i < cnt; i++) {
        if (!frms[i].dpb_used) {
            continue;
        }

        EncFrmStatus *p = &frms[i].status;

        if (p->valid && p->seq_idx == seq_idx) {
            h265e_dbg_dpb("frm %d match slot %d valid %d\n",
                          p->seq_idx, i, p->valid);
            if (frm->save_pass1)
                return &frms[i];
            mpp_assert(p->is_non_ref == frm->is_non_ref);
            mpp_assert(p->is_lt_ref == frm->is_lt_ref);
            mpp_assert(p->lt_idx == frm->lt_idx);
            mpp_assert(p->temporal_id == frm->temporal_id);
            return &frms[i];
        }
    }

    mpp_err_f("can not find match frm %d\n", seq_idx);

    return NULL;
}